

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_internal_defs.hpp
# Opt level: O0

string * iutest::detail::GetTypeName<char32_t>(void)

{
  string *in_RDI;
  char *local_58;
  allocator<char> local_2a;
  undefined1 local_29;
  char *local_28;
  char *read_name;
  char *pcStack_18;
  int status;
  char *name;
  string *str;
  
  pcStack_18 = std::type_info::name((type_info *)&char32_t::typeinfo);
  read_name._4_4_ = 1;
  local_28 = (char *)__cxa_demangle(pcStack_18,0,0,(long)&read_name + 4);
  local_29 = 0;
  local_58 = local_28;
  if (read_name._4_4_ != 0) {
    local_58 = pcStack_18;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,local_58,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  free(local_28);
  return in_RDI;
}

Assistant:

inline ::std::string GetTypeName()
{
#if IUTEST_HAS_RTTI
    const char* const name = typeid(T).name();

#if IUTEST_HAS_HDR_CXXABI
    using abi::__cxa_demangle;
    int status=1;
    char* const read_name = __cxa_demangle(name, 0, 0, &status);
    ::std::string str(status == 0 ? read_name : name);
#if defined(_IUTEST_DEBUG)
    if( status != 0 ) {
        fprintf(stderr, "Unable to demangle \"%s\" -> \"%s\". (status=%d)\n", name, read_name ? read_name : "", status);
        fflush(stderr);
    }
#endif
    free(read_name);
    return str;
#else
    return name;
#endif

#else
    return "<type>";
#endif
}